

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.c
# Opt level: O1

void uv__random_done(uv__work *w,int status)

{
  int iVar1;
  undefined4 in_register_00000034;
  ulong uVar2;
  
  uVar2 = CONCAT44(in_register_00000034,status);
  iVar1 = *(int *)(w[-1].work + 0x20);
  if (iVar1 != 0) {
    *(int *)(w[-1].work + 0x20) = iVar1 + -1;
    if (status == 0) {
      uVar2 = (ulong)*(uint *)&w[-1].done;
    }
    (*(code *)w[-1].wq[1])(&w[-3].loop,uVar2,w[-1].loop,w[-1].wq[0],w[-1].wq[1]);
    return;
  }
  __assert_fail("uv__has_active_reqs(req->loop)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/src/random.c"
                ,0x55,"void uv__random_done(struct uv__work *, int)");
}

Assistant:

static void uv__random_done(struct uv__work* w, int status) {
  uv_random_t* req;

  req = container_of(w, uv_random_t, work_req);
  uv__req_unregister(req->loop, req);

  if (status == 0)
    status = req->status;

  req->cb(req, status, req->buf, req->buflen);
}